

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_rawfile_open(char *filename,int rwmode,int *hdl)

{
  char *pcVar1;
  fitsfile *pfVar2;
  long lVar3;
  double *dvalues;
  size_t sVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  void *ptr;
  char *cptr2;
  char *cptr;
  char rootfile [1025];
  size_t datasize;
  size_t filesize;
  long offset;
  long nvals;
  long ii;
  long dim [5];
  int naxis;
  int bytePerPix;
  int datatype;
  int endian;
  int status;
  short *sptr;
  fitsfile *fptr;
  FILE *diskfile;
  fitsfile *nvals_00;
  int *in_stack_fffffffffffffb40;
  fitsfile *fptr_00;
  char *pcVar8;
  char cVar9;
  undefined7 in_stack_fffffffffffffb59;
  int in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  fitsfile *in_stack_fffffffffffffb68;
  size_t in_stack_fffffffffffffb70;
  size_t *in_stack_fffffffffffffb78;
  void **in_stack_fffffffffffffb80;
  fitsfile **in_stack_fffffffffffffb88;
  long local_90;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  undefined4 local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  FILE **in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  FILE *in_stack_ffffffffffffffd8;
  int local_4;
  
  memset(&local_78,0,0x28);
  local_78 = 1;
  local_70 = 1;
  local_68 = 1;
  local_60 = 1;
  local_58 = 1;
  local_90 = 0;
  fptr_00 = (fitsfile *)0x0;
  if (in_ESI == 0) {
    pcVar1 = strchr(in_RDI,0x5b);
    if (pcVar1 == (char *)0x0) {
      ffpmsg((char *)0x11b1c6);
      ffpmsg((char *)0x11b1d3);
      local_4 = 0x7d;
    }
    else {
      cVar9 = '\0';
      strncat(&stack0xfffffffffffffb58,in_RDI,(long)pcVar1 - (long)in_RDI);
      do {
        pcVar8 = pcVar1;
        pcVar1 = pcVar8 + 1;
      } while (*pcVar1 == ' ');
      if ((*pcVar1 == 'b') || (*pcVar1 == 'B')) {
        local_44 = 8;
        local_48 = 1;
      }
      else if ((*pcVar1 == 'i') || (*pcVar1 == 'I')) {
        local_44 = 0x10;
        local_48 = 2;
      }
      else if ((*pcVar1 == 'u') || (*pcVar1 == 'U')) {
        local_44 = 0x14;
        local_48 = 2;
      }
      else if ((*pcVar1 == 'j') || (*pcVar1 == 'J')) {
        local_44 = 0x20;
        local_48 = 4;
      }
      else if ((((*pcVar1 == 'r') || (*pcVar1 == 'R')) || (*pcVar1 == 'f')) || (*pcVar1 == 'F')) {
        local_44 = -0x20;
        local_48 = 4;
      }
      else {
        if ((*pcVar1 != 'd') && (*pcVar1 != 'D')) {
          ffpmsg((char *)0x11b393);
          ffpmsg((char *)0x11b3a0);
          return 0x7d;
        }
        local_44 = -0x40;
        local_48 = 8;
      }
      pfVar2 = (fitsfile *)(pcVar8 + 2);
      if (((char)pfVar2->HDUposition == 'b') || ((char)pfVar2->HDUposition == 'B')) {
        local_40 = 0;
        pfVar2 = (fitsfile *)(pcVar8 + 3);
      }
      else {
        if (((char)pfVar2->HDUposition == 'l') || ((char)pfVar2->HDUposition == 'L')) {
          pfVar2 = (fitsfile *)(pcVar8 + 3);
        }
        local_40 = 1;
      }
      local_4c = 1;
      local_78 = strtol((char *)pfVar2,(char **)&stack0xfffffffffffffb48,10);
      if ((fptr_00 != (fitsfile *)0x0) && ((char)fptr_00->HDUposition == ',')) {
        local_4c = 2;
        local_70 = strtol((char *)((long)&fptr_00->HDUposition + 1),
                          (char **)&stack0xfffffffffffffb50,10);
        if ((pfVar2 != (fitsfile *)0x0) && ((char)pfVar2->HDUposition == ',')) {
          local_4c = 3;
          local_68 = strtol((char *)((long)&pfVar2->HDUposition + 1),
                            (char **)&stack0xfffffffffffffb48,10);
          if ((fptr_00 != (fitsfile *)0x0) && ((char)fptr_00->HDUposition == ',')) {
            local_4c = 4;
            local_60 = strtol((char *)((long)&fptr_00->HDUposition + 1),
                              (char **)&stack0xfffffffffffffb50,10);
            if ((pfVar2 != (fitsfile *)0x0) && ((char)pfVar2->HDUposition == ',')) {
              local_4c = 5;
            }
            local_58 = strtol((char *)((long)&pfVar2->HDUposition + 1),
                              (char **)&stack0xfffffffffffffb48,10);
          }
        }
      }
      nvals_00 = fptr_00;
      if (fptr_00 < pfVar2) {
        nvals_00 = pfVar2;
      }
      pfVar2 = nvals_00;
      if ((char)nvals_00->HDUposition == ':') {
        local_90 = strtol((char *)((long)&nvals_00->HDUposition + 1),(char **)0x0,10);
      }
      lVar3 = local_78 * local_70 * local_68 * local_60 * local_58;
      lVar6 = (long)local_48;
      lVar7 = (long)local_48;
      local_3c = file_openfile((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                               in_stack_ffffffffffffffc8);
      if (local_3c == 0) {
        local_3c = mem_createmem((size_t)fptr_00,in_stack_fffffffffffffb40);
        if (local_3c == 0) {
          ffimem(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 in_stack_fffffffffffffb70,
                 (_func_void_ptr_void_ptr_size_t *)in_stack_fffffffffffffb68,
                 (int *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
          ffcrim(in_stack_fffffffffffffb68,in_stack_fffffffffffffb64,in_stack_fffffffffffffb60,
                 (long *)CONCAT71(in_stack_fffffffffffffb59,cVar9),&pfVar2->HDUposition);
          ffclos(fptr_00,in_stack_fffffffffffffb40);
          if (local_3c < 1) {
            if (0 < local_90) {
              fseek(in_stack_ffffffffffffffd8,local_90,0);
            }
            dvalues = (double *)(*memTable[*in_RDX].memaddrptr + 0xb40);
            sVar4 = fread(dvalues,1,lVar3 * lVar6,in_stack_ffffffffffffffd8);
            if (sVar4 != lVar3 * lVar6) {
              local_3c = 0x6c;
            }
            fclose(in_stack_ffffffffffffffd8);
            if (local_3c == 0) {
              if (local_44 == 0x14) {
                if (local_40 == 1) {
                  pdVar5 = dvalues;
                  for (local_80 = 0; local_80 < lVar3; local_80 = local_80 + 1) {
                    *(ushort *)pdVar5 = *(ushort *)pdVar5 ^ 0x8000;
                    pdVar5 = (double *)((long)pdVar5 + 2);
                  }
                }
                else {
                  pdVar5 = dvalues;
                  for (local_80 = 0; local_80 < lVar3; local_80 = local_80 + 1) {
                    *(ushort *)pdVar5 = *(ushort *)pdVar5 ^ 0x80;
                    pdVar5 = (double *)((long)pdVar5 + 2);
                  }
                }
              }
              if (local_40 != 0) {
                if ((local_44 == 0x10) || (local_44 == 0x14)) {
                  ffswap2((short *)pfVar2,(long)fptr_00);
                }
                else if ((local_44 == 0x20) || (local_44 == -0x20)) {
                  ffswap4((int *)dvalues,(long)nvals_00);
                }
                else if (local_44 == -0x40) {
                  ffswap8(dvalues,(long)nvals_00);
                }
              }
              memTable[*in_RDX].currentpos = 0;
              memTable[*in_RDX].fitsfilesize = ((lVar3 * lVar7 + 0xb3fU) / 0xb40 + 1) * 0xb40;
              local_4 = 0;
            }
            else {
              mem_close_free(0);
              ffpmsg((char *)0x11b882);
              local_4 = local_3c;
            }
          }
          else {
            ffpmsg((char *)0x11b7a1);
            fclose(in_stack_ffffffffffffffd8);
            mem_close_free(0);
            local_4 = local_3c;
          }
        }
        else {
          ffpmsg((char *)0x11b6ea);
          fclose(in_stack_ffffffffffffffd8);
          local_4 = local_3c;
        }
      }
      else {
        ffpmsg((char *)0x11b69b);
        ffpmsg((char *)0x11b6a5);
        local_4 = local_3c;
      }
    }
  }
  else {
    ffpmsg((char *)0x11b17e);
    ffpmsg((char *)0x11b18b);
    local_4 = 0x70;
  }
  return local_4;
}

Assistant:

int mem_rawfile_open(char *filename, int rwmode, int *hdl)
/*
  This routine creates an empty memory buffer, writes a minimal
  image header, then copies the image data from the raw file into
  memory.  It will byteswap the pixel values if the raw array
  is in little endian byte order.
*/
{
    FILE *diskfile;
    fitsfile *fptr;
    short *sptr;
    int status, endian, datatype, bytePerPix, naxis;
    long dim[5] = {1,1,1,1,1}, ii, nvals, offset = 0;
    size_t filesize = 0, datasize;
    char rootfile[FLEN_FILENAME], *cptr = 0, *cptr2 = 0;
    void *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open raw binary file with WRITE access (mem_rawfile_open)");
        ffpmsg(filename);
        return(READONLY_FILE);
    }

    cptr = strchr(filename, '[');   /* search for opening bracket [ */

    if (!cptr)
    {
        ffpmsg("binary file name missing '[' character (mem_rawfile_open)");
        ffpmsg(filename);
        return(URL_PARSE_ERROR);
    }

    *rootfile = '\0';
    strncat(rootfile, filename, cptr - filename);  /* store the rootname */

    cptr++;

    while (*cptr == ' ')
       cptr++;    /* skip leading blanks */

    /* Get the Data Type of the Image */

    if (*cptr == 'b' || *cptr == 'B')
    {
      datatype = BYTE_IMG;
      bytePerPix = 1;
    }
    else if (*cptr == 'i' || *cptr == 'I')
    {
      datatype = SHORT_IMG;
      bytePerPix = 2;
    }
    else if (*cptr == 'u' || *cptr == 'U')
    {
      datatype = USHORT_IMG;
      bytePerPix = 2;

    }
    else if (*cptr == 'j' || *cptr == 'J')
    {
      datatype = LONG_IMG;
      bytePerPix = 4;
    }  
    else if (*cptr == 'r' || *cptr == 'R' || *cptr == 'f' || *cptr == 'F')
    {
      datatype = FLOAT_IMG;
      bytePerPix = 4;
    }    
    else if (*cptr == 'd' || *cptr == 'D')
    {
      datatype = DOUBLE_IMG;
      bytePerPix = 8;
    }
    else
    {
        ffpmsg("error in raw binary file datatype (mem_rawfile_open)");
        ffpmsg(filename);
        return(URL_PARSE_ERROR);
    }

    cptr++;

    /* get Endian: Big or Little; default is same as the local machine */
    
    if (*cptr == 'b' || *cptr == 'B')
    {
        endian = 0;
        cptr++;
    }
    else if (*cptr == 'l' || *cptr == 'L')
    {
        endian = 1;
        cptr++;
    }
    else
        endian = BYTESWAPPED; /* byteswapped machines are little endian */

    /* read each dimension (up to 5) */

    naxis = 1;
    dim[0] = strtol(cptr, &cptr2, 10);
    
    if (cptr2 && *cptr2 == ',')
    {
      naxis = 2;
      dim[1] = strtol(cptr2+1, &cptr, 10);

      if (cptr && *cptr == ',')
      {
        naxis = 3;
        dim[2] = strtol(cptr+1, &cptr2, 10);

        if (cptr2 && *cptr2 == ',')
        {
          naxis = 4;
          dim[3] = strtol(cptr2+1, &cptr, 10);

          if (cptr && *cptr == ',')
            naxis = 5;
            dim[4] = strtol(cptr+1, &cptr2, 10);
        }
      }
    }

    cptr = maxvalue(cptr, cptr2);

    if (*cptr == ':')   /* read starting offset value */
        offset = strtol(cptr+1, 0, 10);

    nvals = dim[0] * dim[1] * dim[2] * dim[3] * dim[4];
    datasize = nvals * bytePerPix;
    filesize = nvals * bytePerPix + 2880;
    filesize = ((filesize - 1) / 2880 + 1) * 2880; 

    /* open the raw binary disk file */
    status = file_openfile(rootfile, READONLY, &diskfile);
    if (status)
    {
        ffpmsg("failed to open raw  binary file (mem_rawfile_open)");
        ffpmsg(rootfile);
        return(status);
    }

    /* create a memory file with corrct size for the FITS converted raw file */
    status = mem_createmem(filesize, hdl);
    if (status)
    {
        ffpmsg("failed to create memory file (mem_rawfile_open)");
        fclose(diskfile);
        return(status);
    }

    /* open this piece of memory as a new FITS file */
    ffimem(&fptr, (void **) memTable[*hdl].memaddrptr, &filesize, 0, 0, &status);

    /* write the required header keywords */
    ffcrim(fptr, datatype, naxis, dim, &status);

    /* close the FITS file, but keep the memory allocated */
    ffclos(fptr, &status);

    if (status > 0)
    {
        ffpmsg("failed to write basic image header (mem_rawfile_open)");
        fclose(diskfile);
        mem_close_free(*hdl);   /* free up the memory */
        return(status);
    }

    if (offset > 0)
       fseek(diskfile, offset, 0);   /* offset to start of the data */

    /* read the raw data into memory */
    ptr = *memTable[*hdl].memaddrptr + 2880;

    if (fread((char *) ptr, 1, datasize, diskfile) != datasize)
      status = READ_ERROR;

    fclose(diskfile);  /* close the raw binary disk file */

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to copy raw file data into memory (mem_rawfile_open)");
        return(status);
    }

    if (datatype == USHORT_IMG)  /* have to subtract 32768 from each unsigned */
    {                            /* value to conform to FITS convention. More */
                                 /* efficient way to do this is to just flip  */
                                 /* the most significant bit.                 */

      sptr = (short *) ptr;

      if (endian == BYTESWAPPED)  /* working with native format */
      {
        for (ii = 0; ii < nvals; ii++, sptr++)
        {
          *sptr =  ( *sptr ) ^ 0x8000;
        }
      }
      else  /* pixels are byteswapped WRT the native format */
      {
        for (ii = 0; ii < nvals; ii++, sptr++)
        {
          *sptr =  ( *sptr ) ^ 0x80;
        }
      }
    }

    if (endian)  /* swap the bytes if array is in little endian byte order */
    {
      if (datatype == SHORT_IMG || datatype == USHORT_IMG)
      {
        ffswap2( (short *) ptr, nvals);
      }
      else if (datatype == LONG_IMG || datatype == FLOAT_IMG)
      {
        ffswap4( (INT32BIT *) ptr, nvals);
      }

      else if (datatype == DOUBLE_IMG)
      {
        ffswap8( (double *) ptr, nvals);
      }
    }

    memTable[*hdl].currentpos = 0;           /* save starting position */
    memTable[*hdl].fitsfilesize=filesize;    /* and initial file size  */

    return(0);
}